

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_unsigned(lyout *out,int level,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
                        lys_module *module,lys_ext_instance **ext,uint ext_size,uint attr_value)

{
  int iVar1;
  char *local_38;
  char *str;
  
  iVar1 = asprintf(&local_38,"%u",(ulong)attr_value);
  if (iVar1 == -1) {
    ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yang_print_unsigned");
  }
  else {
    yang_print_substmt(out,level,substmt,substmt_index,local_38,module,ext,ext_size);
    free(local_38);
  }
  return;
}

Assistant:

static void
yang_print_unsigned(struct lyout *out, int level, LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                    const struct lys_module *module, struct lys_ext_instance **ext, unsigned int ext_size,
                    unsigned int attr_value)
{
    char *str;

    if (asprintf(&str, "%u", attr_value) == -1) {
        LOGMEM(module->ctx);
        return;
    }
    yang_print_substmt(out, level, substmt, substmt_index, str, module, ext, ext_size);
    free(str);
}